

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

optional<unsigned_int>
wasm::String::anon_unknown_0::takeWTF16CodePoint(string_view *str,bool allowWTF)

{
  short sVar1;
  _Optional_payload_base<unsigned_short> _Var2;
  _Optional_payload_base<unsigned_short> _Var3;
  ulong uVar4;
  undefined1 auStack_38 [8];
  string_view next;
  
  _Var2 = (_Optional_payload_base<unsigned_short>)takeWTF16CodeUnit(str);
  _Var3 = _Var2;
  if (((uint)_Var2 >> 0x10 & 1) != 0) {
    sVar1 = (short)((uint)_Var2 & 0xfc00);
    if (sVar1 == -0x2800) {
      auStack_38 = (undefined1  [8])str->_M_len;
      next._M_len = (size_t)str->_M_str;
      _Var3 = (_Optional_payload_base<unsigned_short>)takeWTF16CodeUnit((string_view *)auStack_38);
      if (((uint)_Var3 & 0x1fc00) == 0x1dc00) {
        uVar4 = 0x100000000;
        str->_M_len = (size_t)auStack_38;
        str->_M_str = (char *)next._M_len;
        _Var3 = (_Optional_payload_base<unsigned_short>)
                (((uint)_Var3 & 0x3ff) + ((int)_Var2 * 0x400 + 0xa00000U & 0x3fffc00) + 0x10000);
        goto LAB_00c919c5;
      }
      if (allowWTF) goto LAB_00c919b8;
    }
    else {
      _Var3._1_3_ = (int3)(((uint)_Var2 & 0xfc00) >> 8);
      _Var3._M_payload._M_value._0_1_ = sVar1 == -0x2400;
      if (sVar1 != -0x2400 || allowWTF) {
LAB_00c919b8:
        uVar4 = 0x100000000;
        _Var3 = (_Optional_payload_base<unsigned_short>)((uint)_Var2 & 0xffff);
        goto LAB_00c919c5;
      }
    }
  }
  uVar4 = 0;
LAB_00c919c5:
  return (optional<unsigned_int>)((uint)_Var3 | uVar4);
}

Assistant:

std::optional<uint32_t> takeWTF16CodePoint(std::string_view& str,
                                           bool allowWTF = true) {
  auto u = takeWTF16CodeUnit(str);
  if (!u) {
    return std::nullopt;
  }

  if (0xD800 <= *u && *u < 0xDC00) {
    // High surrogate; take the next low surrogate if it exists.
    auto next = str;
    auto low = takeWTF16CodeUnit(next);
    if (low && 0xDC00 <= *low && *low < 0xE000) {
      str = next;
      uint16_t highBits = *u - 0xD800;
      uint16_t lowBits = *low - 0xDC00;
      return 0x10000 + ((highBits << 10) | lowBits);
    } else if (!allowWTF) {
      // Unpaired high surrogate.
      return std::nullopt;
    }
  } else if (!allowWTF && 0xDC00 <= *u && *u < 0xE000) {
    // Unpaired low surrogate.
    return std::nullopt;
  }

  return *u;
}